

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int nni_cv_until(nni_cv *cv,nni_time until)

{
  nni_time until_local;
  nni_cv *cv_local;
  
  if (until == 0xffffffffffffffff) {
    nni_plat_cv_wait(cv);
    cv_local._4_4_ = 0;
  }
  else if (until == 0) {
    cv_local._4_4_ = 8;
  }
  else {
    cv_local._4_4_ = nni_plat_cv_until(cv,until);
  }
  return cv_local._4_4_;
}

Assistant:

int
nni_cv_until(nni_cv *cv, nni_time until)
{
	// Some special cases for times.  Catching these here means that
	// platforms can assume a valid time is presented to them.
	if (until == NNI_TIME_NEVER) {
		nni_plat_cv_wait(cv);
		return (0);
	}
	if (until == NNI_TIME_ZERO) {
		return (NNG_EAGAIN);
	}

	return (nni_plat_cv_until(cv, until));
}